

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

size_t duckdb_je_batch_alloc(void **ptrs,size_t num,size_t size,int flags)

{
  uint64_t *puVar1;
  tcache_t *tcache;
  uint64_t *puVar2;
  uint64_t uVar3;
  arena_t *paVar4;
  bool bVar5;
  long lVar6;
  tcaches_t *ptVar7;
  _Bool zero;
  uint uVar8;
  uint uVar9;
  uint binind;
  ulong uVar10;
  size_t sVar11;
  anon_union_8_2_150e8edc_for_tcaches_s_0 aVar12;
  void *pvVar13;
  tcaches_t tVar14;
  ulong extraout_RAX;
  tsd_t *tsd;
  ulong uVar15;
  ulong uVar16;
  cache_bin_t *pcVar17;
  cache_bin_t *pcVar18;
  size_t sVar19;
  size_t i;
  void **ppvVar20;
  ulong uVar21;
  uint uVar22;
  long *in_FS_OFFSET;
  char cVar23;
  arena_t *local_d8;
  ulong local_b8;
  te_ctx_t local_58;
  
  tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  if (tsd == (tsd_t *)0x0) {
    return 0;
  }
  if ('\0' < tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level) {
    return 0;
  }
  uVar15 = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  if (uVar15 == 0) {
    if (size < 0x1001) {
      uVar16 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
      goto LAB_0117148f;
    }
    if (size < 0x7000000000000001) {
      uVar15 = size * 2 - 1;
      lVar6 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar15 = -1L << (0x3c - ((byte)lVar6 ^ 0x3f) & 0x3f);
      uVar16 = ~uVar15 + size & uVar15;
      goto LAB_0117148f;
    }
  }
  else {
    if ((uVar15 < 0x1001 && size < 0x3801) &&
       (duckdb_je_batch_alloc_cold_1(), (extraout_RAX & 1) != 0)) {
      uVar16 = CONCAT71(local_58._1_7_,local_58.is_alloc);
      goto LAB_0117148f;
    }
    if (uVar15 < 0x7000000000000001) {
      uVar10 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar16 = size * 2 - 1;
          lVar6 = 0x3f;
          if (uVar16 != 0) {
            for (; uVar16 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          uVar10 = -1L << (0x3c - ((byte)lVar6 ^ 0x3f) & 0x3f);
          uVar10 = ~uVar10 + size & uVar10;
        }
        else {
          uVar10 = 0;
        }
        if (uVar10 < size) goto LAB_01171429;
      }
      uVar16 = 0;
      if (uVar10 <= (duckdb_je_sz_large_pad + (uVar15 + 0xfff & 0x7ffffffffffff000) + uVar10) -
                    0x1000) {
        uVar16 = uVar10;
      }
      goto LAB_0117148f;
    }
  }
LAB_01171429:
  uVar16 = 0;
LAB_0117148f:
  if (uVar16 + 0x8fffffffffffffff < 0x9000000000000000) {
    return 0;
  }
  if (uVar16 < 0x1001) {
    binind = (uint)duckdb_je_sz_size2index_tab[uVar16 + 7 >> 3];
  }
  else {
    binind = sz_size2index_compute(uVar16);
  }
  if (binind < 0x24) {
    local_b8 = (ulong)duckdb_je_bin_infos[binind].nregs;
  }
  else {
    local_b8 = 0;
  }
  zero = (_Bool)((byte)((flags & 0x40U) >> 6) | duckdb_je_opt_zero);
  tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
  uVar8 = flags & 0xfff00;
  puVar2 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
  puVar1 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
  local_d8 = (arena_t *)0x0;
  pcVar18 = (cache_bin_t *)0x0;
  sVar19 = 0;
  do {
    uVar15 = num - sVar19;
    if (num < sVar19 || uVar15 == 0) {
      return sVar19;
    }
    if ((binind < 0x24) && (local_b8 <= uVar15)) {
      if (local_d8 != (arena_t *)0x0) {
LAB_01171667:
        sVar11 = duckdb_je_arena_fill_small_fresh
                           ((tsdn_t *)tsd,local_d8,binind,ptrs + sVar19,uVar15 - uVar15 % local_b8,
                            zero);
        sVar19 = sVar19 + sVar11;
        goto LAB_011716a7;
      }
      uVar10 = 0xffffffff;
      if (0xfffff < (uint)flags) {
        uVar10 = (ulong)(((uint)flags >> 0x14) - 1);
      }
      uVar22 = (uint)uVar10;
      if (uVar22 == 0xffffffff) {
        local_d8 = (arena_t *)0x0;
LAB_0117161e:
        bVar5 = false;
      }
      else {
        local_d8 = (arena_t *)duckdb_je_arenas[uVar10].repr;
        if (local_d8 == (arena_t *)0x0) {
          local_d8 = duckdb_je_arena_init((tsdn_t *)tsd,uVar22,&duckdb_je_arena_config_default);
        }
        if (local_d8 != (arena_t *)0x0) goto LAB_0117161e;
        bVar5 = duckdb_je_narenas_auto <= uVar22;
      }
      if (bVar5) {
        cVar23 = true;
        bVar5 = false;
      }
      else {
        if (local_d8 == (arena_t *)0x0) {
          if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01')
          {
            local_d8 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
            if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena == (arena_t *)0x0)
               && (local_d8 = duckdb_je_arena_choose_hard(tsd,false),
                  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)
               ) {
              paVar4 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).
                       arena;
              if (paVar4 == (arena_t *)0x0) {
                duckdb_je_tcache_arena_associate
                          ((tsdn_t *)tsd,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                           tcache,local_d8);
              }
              else if (paVar4 != local_d8) {
                duckdb_je_tcache_arena_reassociate
                          ((tsdn_t *)tsd,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                           tcache,local_d8);
              }
            }
          }
          else {
            local_d8 = (arena_t *)duckdb_je_arenas[0].repr;
            if (duckdb_je_arenas[0].repr == (void *)0x0) {
              local_d8 = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
            }
          }
        }
        cVar23 = local_d8 == (arena_t *)0x0;
        bVar5 = !(bool)cVar23;
      }
      if (bVar5) goto LAB_01171667;
    }
    else {
      sVar11 = 0;
LAB_011716a7:
      ptVar7 = duckdb_je_tcaches;
      uVar10 = 0xfffffffe;
      if (uVar8 != 0) {
        if (uVar8 == 0x100) {
          uVar10 = 0xffffffff;
        }
        else {
          uVar10 = (ulong)((uVar8 >> 8) - 2);
        }
      }
      if ((int)uVar10 == -1) {
        aVar12.tcache = (tcache_t *)0x0;
      }
      else if ((int)uVar10 == -2) {
        aVar12.tcache = (tcache_t *)0x0;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
          aVar12.tcache = tcache;
        }
      }
      else {
        if (duckdb_je_tcaches[uVar10].field_0.tcache == (tcache_t *)0x0) {
          duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
          abort();
        }
        if (duckdb_je_tcaches[uVar10].field_0.tcache == (tcache_t *)&DAT_00000001) {
          tVar14.field_0 =
               (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcache_create_explicit(tsd);
          ptVar7[uVar10].field_0 = tVar14.field_0;
        }
        aVar12.tcache = ptVar7[uVar10].field_0.tcache;
      }
      if ((((aVar12.tcache != (tcache_t *)0x0) &&
           (binind < (aVar12.tcache)->tcache_slow->tcache_nbins)) &&
          ((aVar12.tcache)->bins[binind].stack_head != (void **)&duckdb_je_disabled_bin)) &&
         (uVar10 = uVar15 - sVar11, sVar11 <= uVar15 && uVar10 != 0)) {
        pcVar17 = (aVar12.tcache)->bins + binind;
        if (pcVar18 != (cache_bin_t *)0x0) {
          pcVar17 = pcVar18;
        }
        uVar9 = (*(int *)&pcVar17->low_bits_empty - (int)pcVar17->stack_head & 0xffffU) >> 3;
        uVar22 = (uint)uVar10;
        if (uVar9 <= uVar10) {
          uVar22 = uVar9;
        }
        uVar10 = (ulong)(uVar22 & 0xffff);
        uVar21 = (ulong)((uVar22 & 0xffff) * 8);
        switchD_00b1422a::default(ptrs + sVar19,pcVar17->stack_head,uVar21);
        ppvVar20 = (void **)(uVar21 + (long)pcVar17->stack_head);
        pcVar17->stack_head = ppvVar20;
        if ((ushort)((*(int *)&pcVar17->low_bits_empty - (int)ppvVar20 & 0xffffU) >> 3) <
            (ushort)((short)*(int *)&pcVar17->low_bits_empty - pcVar17->low_bits_low_water) >> 3) {
          pcVar17->low_bits_low_water = (uint16_t)ppvVar20;
        }
        (pcVar17->tstats).nrequests = (pcVar17->tstats).nrequests + uVar10;
        if (zero == true && uVar10 != 0) {
          uVar21 = 0;
          do {
            switchD_005700f1::default((ptrs + sVar19)[uVar21],0,uVar16);
            uVar21 = uVar21 + 1;
          } while (uVar10 != uVar21);
        }
        sVar11 = sVar11 + uVar10;
        sVar19 = sVar19 + uVar10;
        pcVar18 = pcVar17;
      }
      local_58.is_alloc = true;
      uVar3 = *puVar2;
      *puVar2 = uVar3 + sVar11 * uVar16;
      local_58.current = puVar2;
      local_58.last_event =
           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
      local_58.next_event = puVar1;
      local_58.next_event_fast =
           &tsd->
            cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
      if (*puVar1 - uVar3 <= sVar11 * uVar16) {
        duckdb_je_te_event_trigger(tsd,&local_58);
      }
      cVar23 = '\0';
      if (sVar11 < uVar15) {
        pvVar13 = duckdb_je_mallocx(size,flags);
        if (pvVar13 == (void *)0x0) {
          cVar23 = '\x02';
        }
        else {
          ptrs[sVar19] = pvVar13;
          sVar19 = sVar19 + 1;
        }
      }
    }
    if (cVar23 != '\0') {
      return sVar19;
    }
  } while( true );
}

Assistant:

size_t
batch_alloc(void **ptrs, size_t num, size_t size, int flags) {
	LOG("core.batch_alloc.entry",
	    "ptrs: %p, num: %zu, size: %zu, flags: %d", ptrs, num, size, flags);

	tsd_t *tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	size_t filled = 0;

	if (unlikely(tsd == NULL || tsd_reentrancy_level_get(tsd) > 0)) {
		goto label_done;
	}

	size_t alignment = MALLOCX_ALIGN_GET(flags);
	size_t usize;
	if (aligned_usize_get(size, alignment, &usize, NULL, false)) {
		goto label_done;
	}
	szind_t ind = sz_size2index(usize);
	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	/*
	 * The cache bin and arena will be lazily initialized; it's hard to
	 * know in advance whether each of them needs to be initialized.
	 */
	cache_bin_t *bin = NULL;
	arena_t *arena = NULL;

	size_t nregs = 0;
	if (likely(ind < SC_NBINS)) {
		nregs = bin_infos[ind].nregs;
		assert(nregs > 0);
	}

	while (filled < num) {
		size_t batch = num - filled;
		size_t surplus = SIZE_MAX; /* Dead store. */
		bool prof_sample_event = config_prof && opt_prof
		    && prof_active_get_unlocked()
		    && te_prof_sample_event_lookahead_surplus(tsd,
		    batch * usize, &surplus);

		if (prof_sample_event) {
			/*
			 * Adjust so that the batch does not trigger prof
			 * sampling.
			 */
			batch -= surplus / usize + 1;
			batch_alloc_prof_sample_assert(tsd, batch, usize);
		}

		size_t progress = 0;

		if (likely(ind < SC_NBINS) && batch >= nregs) {
			if (arena == NULL) {
				unsigned arena_ind = mallocx_arena_get(flags);
				if (arena_get_from_ind(tsd, arena_ind,
				    &arena)) {
					goto label_done;
				}
				if (arena == NULL) {
					arena = arena_choose(tsd, NULL);
				}
				if (unlikely(arena == NULL)) {
					goto label_done;
				}
			}
			size_t arena_batch = batch - batch % nregs;
			size_t n = arena_fill_small_fresh(tsd_tsdn(tsd), arena,
			    ind, ptrs + filled, arena_batch, zero);
			progress += n;
			filled += n;
		}

		unsigned tcache_ind = mallocx_tcache_get(flags);
		tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind,
		    /* slow */ true, /* is_alloc */ true);
		if (likely(tcache != NULL &&
		    ind < tcache_nbins_get(tcache->tcache_slow) &&
		    !tcache_bin_disabled(ind, &tcache->bins[ind],
		    tcache->tcache_slow)) && progress < batch) {
			if (bin == NULL) {
				bin = &tcache->bins[ind];
			}
			/*
			 * If we don't have a tcache bin, we don't want to
			 * immediately give up, because there's the possibility
			 * that the user explicitly requested to bypass the
			 * tcache, or that the user explicitly turned off the
			 * tcache; in such cases, we go through the slow path,
			 * i.e. the mallocx() call at the end of the while loop.
			 */
			if (bin != NULL) {
				size_t bin_batch = batch - progress;
				/*
				 * n can be less than bin_batch, meaning that
				 * the cache bin does not have enough memory.
				 * In such cases, we rely on the slow path,
				 * i.e. the mallocx() call at the end of the
				 * while loop, to fill in the cache, and in the
				 * next iteration of the while loop, the tcache
				 * will contain a lot of memory, and we can
				 * harvest them here.  Compared to the
				 * alternative approach where we directly go to
				 * the arena bins here, the overhead of our
				 * current approach should usually be minimal,
				 * since we never try to fetch more memory than
				 * what a slab contains via the tcache.  An
				 * additional benefit is that the tcache will
				 * not be empty for the next allocation request.
				 */
				size_t n = cache_bin_alloc_batch(bin, bin_batch,
				    ptrs + filled);
				if (config_stats) {
					bin->tstats.nrequests += n;
				}
				if (zero) {
					for (size_t i = 0; i < n; ++i) {
						memset(ptrs[filled + i], 0,
						    usize);
					}
				}
				if (config_prof && opt_prof
				    && unlikely(ind >= SC_NBINS)) {
					for (size_t i = 0; i < n; ++i) {
						prof_tctx_reset_sampled(tsd,
						    ptrs[filled + i]);
					}
				}
				progress += n;
				filled += n;
			}
		}

		/*
		 * For thread events other than prof sampling, trigger them as
		 * if there's a single allocation of size (n * usize).  This is
		 * fine because:
		 * (a) these events do not alter the allocation itself, and
		 * (b) it's possible that some event would have been triggered
		 *     multiple times, instead of only once, if the allocations
		 *     were handled individually, but it would do no harm (or
		 *     even be beneficial) to coalesce the triggerings.
		 */
		thread_alloc_event(tsd, progress * usize);

		if (progress < batch || prof_sample_event) {
			void *p = je_mallocx(size, flags);
			if (p == NULL) { /* OOM */
				break;
			}
			if (progress == batch) {
				assert(prof_sampled(tsd, p));
			}
			ptrs[filled++] = p;
		}
	}

label_done:
	check_entry_exit_locking(tsd_tsdn(tsd));
	LOG("core.batch_alloc.exit", "result: %zu", filled);
	return filled;
}